

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qform_.c
# Opt level: O2

void qform_(int *m,int *n,double *q,int *ldq,double *wa)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  double *pdVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  double *pdVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  
  iVar6 = *ldq;
  uVar11 = (ulong)iVar6;
  uVar16 = ~uVar11;
  uVar5 = *m;
  lVar3 = (long)(int)uVar5;
  uVar2 = *n;
  lVar14 = (long)(int)uVar2;
  uVar9 = uVar2;
  if ((int)uVar5 < (int)uVar2) {
    uVar9 = uVar5;
  }
  if (1 < (int)uVar9) {
    pdVar4 = q + uVar16 + uVar11 * 2 + 1;
    lVar12 = 8;
    for (uVar17 = 2; uVar17 != uVar9 + 1; uVar17 = uVar17 + 1) {
      for (lVar7 = 0; lVar12 != lVar7; lVar7 = lVar7 + 8) {
        *(undefined8 *)((long)pdVar4 + lVar7) = 0;
      }
      pdVar4 = pdVar4 + uVar11;
      lVar12 = lVar12 + 8;
    }
  }
  iVar6 = iVar6 + 1;
  if ((int)uVar2 < (int)uVar5) {
    uVar2 = 0;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    pdVar4 = q + (lVar14 + 1) * uVar11 + uVar16 + 1;
    while (lVar14 < lVar3) {
      lVar14 = lVar14 + 1;
      for (uVar17 = 0; uVar2 != uVar17; uVar17 = uVar17 + 1) {
        pdVar4[uVar17] = 0.0;
      }
      q[uVar16 + (long)(iVar6 * (int)lVar14)] = 1.0;
      pdVar4 = pdVar4 + uVar11;
    }
  }
  lVar14 = (long)(int)uVar9;
  uVar5 = 0;
  if (0 < (int)uVar9) {
    uVar5 = uVar9;
  }
  pdVar4 = q + uVar11 * lVar14 + uVar16;
  for (uVar17 = 1; uVar17 != uVar5 + 1; uVar17 = uVar17 + 1) {
    lVar7 = (long)(int)uVar9;
    pdVar8 = (double *)((long)q + (uVar11 * 8 + 8) * lVar7 + uVar16 * 8);
    lVar15 = lVar14 - uVar17;
    for (lVar12 = lVar7; lVar12 <= lVar3; lVar12 = lVar12 + 1) {
      wa[lVar12 + -1] = pdVar4[lVar12];
      pdVar4[lVar12] = 0.0;
    }
    q[uVar16 + (long)(((int)lVar15 + 1) * iVar6)] = 1.0;
    lVar12 = lVar7;
    if ((wa[lVar15] != 0.0) || (NAN(wa[lVar15]))) {
      for (; lVar12 <= lVar3; lVar12 = lVar12 + 1) {
        dVar18 = 0.0;
        pdVar13 = pdVar8;
        for (lVar10 = lVar7; lVar10 <= lVar3; lVar10 = lVar10 + 1) {
          dVar18 = dVar18 + *pdVar13 * wa[lVar10 + -1];
          pdVar13 = pdVar13 + 1;
        }
        dVar1 = wa[lVar15];
        for (lVar10 = 0; lVar7 + lVar10 <= lVar3; lVar10 = lVar10 + 1) {
          pdVar8[lVar10] = wa[lVar7 + lVar10 + -1] * (-dVar18 / dVar1) + pdVar8[lVar10];
        }
        pdVar8 = pdVar8 + uVar11;
      }
    }
    uVar9 = uVar9 - 1;
    pdVar4 = pdVar4 + -uVar11;
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(qform)(const int *m, const int *n, real *q, const int *
	ldq, real *wa)
{
    /* System generated locals */
    int q_dim1, q_offset, i__1, i__2, i__3;

    /* Local variables */
    int i__, j, k, l, jm1, np1;
    real sum, temp;
    int minmn;

/*     ********** */

/*     subroutine qform */

/*     this subroutine proceeds from the computed qr factorization of */
/*     an m by n matrix a to accumulate the m by m orthogonal matrix */
/*     q from its factored form. */

/*     the subroutine statement is */

/*       subroutine qform(m,n,q,ldq,wa) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of rows of a and the order of q. */

/*       n is a positive integer input variable set to the number */
/*         of columns of a. */

/*       q is an m by m array. on input the full lower trapezoid in */
/*         the first min(m,n) columns of q contains the factored form. */
/*         on output q has been accumulated into a square matrix. */

/*       ldq is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array q. */

/*       wa is a work array of length m. */

/*     subprograms called */

/*       fortran-supplied ... min0 */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa;
    q_dim1 = *ldq;
    q_offset = 1 + q_dim1 * 1;
    q -= q_offset;

    /* Function Body */

/*     zero out upper triangle of q in the first min(m,n) columns. */

    minmn = min(*m,*n);
    if (minmn < 2) {
	goto L30;
    }
    i__1 = minmn;
    for (j = 2; j <= i__1; ++j) {
	jm1 = j - 1;
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    q[i__ + j * q_dim1] = 0.;
/* L10: */
	}
/* L20: */
    }
L30:

/*     initialize remaining columns to those of the identity matrix. */

    np1 = *n + 1;
    if (*m < np1) {
	goto L60;
    }
    i__1 = *m;
    for (j = np1; j <= i__1; ++j) {
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    q[i__ + j * q_dim1] = 0.;
/* L40: */
	}
	q[j + j * q_dim1] = 1.;
/* L50: */
    }
L60:

/*     accumulate q from its factored form. */

    i__1 = minmn;
    for (l = 1; l <= i__1; ++l) {
	k = minmn - l + 1;
	i__2 = *m;
	for (i__ = k; i__ <= i__2; ++i__) {
	    wa[i__] = q[i__ + k * q_dim1];
	    q[i__ + k * q_dim1] = 0.;
/* L70: */
	}
	q[k + k * q_dim1] = 1.;
	if (wa[k] == 0.) {
	    goto L110;
	}
	i__2 = *m;
	for (j = k; j <= i__2; ++j) {
	    sum = 0.;
	    i__3 = *m;
	    for (i__ = k; i__ <= i__3; ++i__) {
		sum += q[i__ + j * q_dim1] * wa[i__];
/* L80: */
	    }
	    temp = sum / wa[k];
	    i__3 = *m;
	    for (i__ = k; i__ <= i__3; ++i__) {
		q[i__ + j * q_dim1] -= temp * wa[i__];
/* L90: */
	    }
/* L100: */
	}
L110:
/* L120: */
	;
    }
    return;

/*     last card of subroutine qform. */

}